

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

QRgba64 * fetchRGBA16FToRGBA64PM_avx2
                    (QRgba64 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                    QDitherInfo *param_6)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QRgba64 *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  __m128i vsi_1;
  __m128 vsa_1;
  __m128 vsf_1;
  __m256i vsi;
  __m256 vsa;
  __m256 vsf;
  int i;
  __m256 vh;
  __m256 vf;
  quint64 *s;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  int local_3e4;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_230;
  float fStack_22c;
  float fStack_228;
  
  lVar1 = in_RSI + (long)in_EDX * 8;
  vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar2 = vinsertps_avx(ZEXT416(0x477fff00),ZEXT416(0x477fff00),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x477fff00),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x477fff00),0x30);
  auVar3 = vinsertps_avx(ZEXT416(0x477fff00),ZEXT416(0x477fff00),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0x477fff00),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0x477fff00),0x30);
  auVar8 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x20);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x30);
  auVar4 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f000000),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f000000),0x30);
  auVar7 = ZEXT3264(CONCAT1616(auVar8,auVar4));
  for (local_3e4 = 0; local_3e4 + 1 < in_ECX; local_3e4 = local_3e4 + 2) {
    vpcmpeqd_avx2(auVar7._0_32_,auVar7._0_32_);
    auVar6 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar1 + (long)local_3e4 * 8));
    auVar5 = vpermilps_avx(auVar6,0xff);
    local_2c0 = auVar6._0_4_;
    fStack_2bc = auVar6._4_4_;
    fStack_2b8 = auVar6._8_4_;
    fStack_2b4 = auVar6._12_4_;
    fStack_2b0 = auVar6._16_4_;
    fStack_2ac = auVar6._20_4_;
    fStack_2a8 = auVar6._24_4_;
    uStack_2a4 = auVar6._28_4_;
    local_2e0 = auVar5._0_4_;
    fStack_2dc = auVar5._4_4_;
    fStack_2d8 = auVar5._8_4_;
    fStack_2d4 = auVar5._12_4_;
    fStack_2d0 = auVar5._16_4_;
    fStack_2cc = auVar5._20_4_;
    fStack_2c8 = auVar5._24_4_;
    local_420._4_4_ = fStack_2bc * fStack_2dc;
    local_420._0_4_ = local_2c0 * local_2e0;
    fStack_418 = fStack_2b8 * fStack_2d8;
    fStack_414 = fStack_2b4 * fStack_2d4;
    fStack_410 = fStack_2b0 * fStack_2d0;
    fStack_40c = fStack_2ac * fStack_2cc;
    fStack_408 = fStack_2a8 * fStack_2c8;
    uStack_404 = uStack_2a4;
    auVar5 = vblendps_avx(_local_420,auVar5,0x88);
    local_300 = auVar5._0_4_;
    fStack_2fc = auVar5._4_4_;
    fStack_2f8 = auVar5._8_4_;
    fStack_2f4 = auVar5._12_4_;
    fStack_2f0 = auVar5._16_4_;
    fStack_2ec = auVar5._20_4_;
    fStack_2e8 = auVar5._24_4_;
    fStack_2e4 = auVar5._28_4_;
    local_320 = auVar2._0_4_;
    fStack_31c = auVar2._4_4_;
    fStack_318 = auVar2._8_4_;
    fStack_314 = auVar2._12_4_;
    fStack_310 = auVar3._0_4_;
    fStack_30c = auVar3._4_4_;
    fStack_308 = auVar3._8_4_;
    local_2a0 = auVar4._0_4_;
    fStack_29c = auVar4._4_4_;
    fStack_298 = auVar4._8_4_;
    fStack_294 = auVar4._12_4_;
    fStack_290 = auVar8._0_4_;
    fStack_28c = auVar8._4_4_;
    fStack_288 = auVar8._8_4_;
    fStack_284 = auVar8._12_4_;
    local_460._4_4_ = (int)(fStack_2fc * fStack_31c + fStack_29c);
    local_460._0_4_ = (int)(local_300 * local_320 + local_2a0);
    local_460._8_4_ = (int)(fStack_2f8 * fStack_318 + fStack_298);
    local_460._12_4_ = (int)(fStack_2f4 * fStack_314 + fStack_294);
    uStack_450._0_4_ = (int)(fStack_2f0 * fStack_310 + fStack_290);
    uStack_450._4_4_ = (int)(fStack_2ec * fStack_30c + fStack_28c);
    uStack_448._0_4_ = (int)(fStack_2e8 * fStack_308 + fStack_288);
    uStack_448._4_4_ = (int)(fStack_2e4 + fStack_284);
    auVar5 = _local_460;
    uStack_448 = auVar5._24_8_;
    auVar6._16_8_ = uStack_450;
    auVar6._0_16_ = local_460;
    auVar6._24_8_ = uStack_448;
    auVar5._16_8_ = uStack_450;
    auVar5._0_16_ = local_460;
    auVar5._24_8_ = uStack_448;
    auVar5 = vpackusdw_avx2(auVar6,auVar5);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    auVar7 = ZEXT1664(auVar5._0_16_);
    *(undefined1 (*) [16])(in_RDI + local_3e4) = auVar5._0_16_;
  }
  if (local_3e4 < in_ECX) {
    vpcmpeqd_avx(auVar7._0_16_,auVar7._0_16_);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(lVar1 + (long)local_3e4 * 8);
    auVar2 = vcvtph2ps_f16c(auVar8);
    fStack_464 = auVar2._12_4_;
    local_480._4_4_ = fStack_464;
    local_480._0_4_ = fStack_464;
    fStack_478 = fStack_464;
    fStack_474 = fStack_464;
    local_230 = auVar2._0_4_;
    fStack_22c = auVar2._4_4_;
    fStack_228 = auVar2._8_4_;
    local_470._4_4_ = fStack_22c * fStack_464;
    local_470._0_4_ = local_230 * fStack_464;
    fStack_468 = fStack_228 * fStack_464;
    fStack_464 = fStack_464 * fStack_464;
    auVar2 = vinsertps_avx(_local_470,_local_480,0x30);
    local_250 = auVar2._0_4_;
    fStack_24c = auVar2._4_4_;
    fStack_248 = auVar2._8_4_;
    fStack_244 = auVar2._12_4_;
    local_490 = CONCAT44((int)(fStack_24c * 65535.0 + 0.5),(int)(local_250 * 65535.0 + 0.5));
    uStack_488._0_4_ = (int)(fStack_248 * 65535.0 + 0.5);
    uStack_488._4_4_ = (int)(fStack_244 * 65535.0 + 0.5);
    auVar3._8_8_ = uStack_488;
    auVar3._0_8_ = local_490;
    auVar2._8_8_ = uStack_488;
    auVar2._0_8_ = local_490;
    auVar2 = vpackusdw_avx(auVar3,auVar2);
    local_490 = auVar2._0_8_;
    in_RDI[local_3e4].rgba = local_490;
  }
  return in_RDI;
}

Assistant:

const QRgba64 *QT_FASTCALL fetchRGBA16FToRGBA64PM_avx2(QRgba64 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    const __m256 vf = _mm256_set1_ps(65535.0f);
    const __m256 vh = _mm256_set1_ps(0.5f);
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        vsf = _mm256_mul_ps(vsf, vf);
        vsf = _mm256_add_ps(vsf, vh);
        __m256i vsi = _mm256_cvttps_epi32(vsf);
        vsi = _mm256_packus_epi32(vsi, vsi);
        vsi = _mm256_permute4x64_epi64(vsi, _MM_SHUFFLE(3, 1, 2, 0));
        _mm_storeu_si128((__m128i *)(buffer + i), _mm256_castsi256_si128(vsi));
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        vsf = _mm_mul_ps(vsf, _mm_set1_ps(65535.0f));
        vsf = _mm_add_ps(vsf, _mm_set1_ps(0.5f));
        __m128i vsi = _mm_cvttps_epi32(vsf);
        vsi = _mm_packus_epi32(vsi, vsi);
        _mm_storel_epi64((__m128i *)(buffer + i), vsi);
    }
    return buffer;
}